

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<_drmModeModeInfo>::reserve(QList<_drmModeModeInfo> *this,qsizetype asize)

{
  bool bVar1;
  Int IVar2;
  QArrayDataPointer<_drmModeModeInfo> *this_00;
  qsizetype qVar3;
  _drmModeModeInfo *e;
  _drmModeModeInfo *b;
  Data *pDVar4;
  long in_RSI;
  QArrayDataPointer<_drmModeModeInfo> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<_drmModeModeInfo> *in_stack_ffffffffffffff78;
  QFlagsStorage<QArrayData::ArrayOption> f;
  QArrayDataPointer<_drmModeModeInfo> *in_stack_ffffffffffffff80;
  QArrayDataPointer<_drmModeModeInfo> *in_stack_ffffffffffffff88;
  AllocationOption option;
  QPodArrayOps<_drmModeModeInfo> *in_stack_ffffffffffffff90;
  qsizetype local_40;
  QArrayDataPointer<_drmModeModeInfo> local_38;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_18;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QArrayDataPointer<_drmModeModeInfo> *)capacity((QList<_drmModeModeInfo> *)0x16a22f);
  qVar3 = QArrayDataPointer<_drmModeModeInfo>::freeSpaceAtBegin(in_stack_ffffffffffffff88);
  option = (AllocationOption)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (in_RSI <= (long)this_00 - qVar3) {
    QArrayDataPointer<_drmModeModeInfo>::operator->(in_RDI);
    local_18.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QArrayDataPointer<_drmModeModeInfo>::flags(in_stack_ffffffffffffff80);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,
                    (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
    if (IVar2 != 0) goto LAB_0016a3d2;
    QArrayDataPointer<_drmModeModeInfo>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<_drmModeModeInfo>::isShared(in_stack_ffffffffffffff80);
    if (!bVar1) {
      QArrayDataPointer<_drmModeModeInfo>::operator->(in_RDI);
      f.i = (Int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,f.i);
      QArrayDataPointer<_drmModeModeInfo>::setFlag
                ((QArrayDataPointer<_drmModeModeInfo> *)0x16a2d6,(ArrayOptions)f.i);
      goto LAB_0016a3d2;
    }
  }
  local_38.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_38.ptr = (_drmModeModeInfo *)0xaaaaaaaaaaaaaaaa;
  local_38.size = -0x5555555555555556;
  local_40 = size((QList<_drmModeModeInfo> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  QArrayDataPointer<_drmModeModeInfo>::QArrayDataPointer
            (this_00,(qsizetype)in_RDI,(qsizetype)in_stack_ffffffffffffff90,option);
  e = (_drmModeModeInfo *)QArrayDataPointer<_drmModeModeInfo>::operator->(&local_38);
  QArrayDataPointer<_drmModeModeInfo>::operator->(in_RDI);
  b = QArrayDataPointer<_drmModeModeInfo>::begin((QArrayDataPointer<_drmModeModeInfo> *)0x16a356);
  QArrayDataPointer<_drmModeModeInfo>::operator->(in_RDI);
  QArrayDataPointer<_drmModeModeInfo>::end((QArrayDataPointer<_drmModeModeInfo> *)e);
  QtPrivate::QPodArrayOps<_drmModeModeInfo>::copyAppend(in_stack_ffffffffffffff90,b,e);
  pDVar4 = QArrayDataPointer<_drmModeModeInfo>::d_ptr(&local_38);
  if (pDVar4 != (Data *)0x0) {
    in_stack_ffffffffffffff78 =
         (QArrayDataPointer<_drmModeModeInfo> *)
         QArrayDataPointer<_drmModeModeInfo>::operator->(&local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)e,
               (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    QArrayDataPointer<_drmModeModeInfo>::setFlag
              ((QArrayDataPointer<_drmModeModeInfo> *)0x16a3b9,
               (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)
               SUB84((ulong)in_stack_ffffffffffffff78 >> 0x20,0));
  }
  QArrayDataPointer<_drmModeModeInfo>::swap
            ((QArrayDataPointer<_drmModeModeInfo> *)e,in_stack_ffffffffffffff78);
  QArrayDataPointer<_drmModeModeInfo>::~QArrayDataPointer((QArrayDataPointer<_drmModeModeInfo> *)e);
LAB_0016a3d2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}